

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmInstallGenerator.cxx
# Opt level: O2

MessageLevel cmInstallGenerator::SelectMessageLevel(cmMakefile *mf,bool never)

{
  bool bVar1;
  string *psVar2;
  MessageLevel MVar3;
  undefined7 in_register_00000031;
  allocator<char> local_51;
  string m;
  string local_30;
  
  if ((int)CONCAT71(in_register_00000031,never) == 0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_30,"CMAKE_INSTALL_MESSAGE",&local_51);
    psVar2 = cmMakefile::GetSafeDefinition(mf,&local_30);
    std::__cxx11::string::string((string *)&m,(string *)psVar2);
    std::__cxx11::string::~string((string *)&local_30);
    bVar1 = std::operator==(&m,"ALWAYS");
    if (bVar1) {
      MVar3 = MessageAlways;
    }
    else {
      bVar1 = std::operator==(&m,"LAZY");
      if (bVar1) {
        MVar3 = MessageLazy;
      }
      else {
        bVar1 = std::operator==(&m,"NEVER");
        MVar3 = (uint)bVar1 + (uint)bVar1 * 2;
      }
    }
    std::__cxx11::string::~string((string *)&m);
  }
  else {
    MVar3 = MessageNever;
  }
  return MVar3;
}

Assistant:

cmInstallGenerator::MessageLevel cmInstallGenerator::SelectMessageLevel(
  cmMakefile* mf, bool never)
{
  if (never) {
    return MessageNever;
  }
  std::string m = mf->GetSafeDefinition("CMAKE_INSTALL_MESSAGE");
  if (m == "ALWAYS") {
    return MessageAlways;
  }
  if (m == "LAZY") {
    return MessageLazy;
  }
  if (m == "NEVER") {
    return MessageNever;
  }
  return MessageDefault;
}